

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int __thiscall
glslang::TIntermediate::addUsedOffsets(TIntermediate *this,int binding,int offset,int numOffsets)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  int *piVar4;
  ulong local_60;
  size_t r;
  undefined1 local_44 [8];
  TOffsetRange range;
  TRange offsetRange;
  TRange bindingRange;
  int numOffsets_local;
  int offset_local;
  int binding_local;
  TIntermediate *this_local;
  
  bindingRange.start = numOffsets;
  bindingRange.last = offset;
  TRange::TRange(&offsetRange,binding,binding);
  TRange::TRange(&range.offset,bindingRange.last,bindingRange.last + bindingRange.start + -1);
  TOffsetRange::TOffsetRange((TOffsetRange *)local_44,offsetRange,range.offset);
  local_60 = 0;
  while( true ) {
    sVar2 = std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::size
                      (&this->usedAtomics);
    if (sVar2 <= local_60) {
      std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::push_back
                (&this->usedAtomics,(value_type *)local_44);
      return -1;
    }
    pvVar3 = std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::operator[]
                       (&this->usedAtomics,local_60);
    bVar1 = TOffsetRange::overlap((TOffsetRange *)local_44,pvVar3);
    if (bVar1) break;
    local_60 = local_60 + 1;
  }
  pvVar3 = std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::operator[]
                     (&this->usedAtomics,local_60);
  piVar4 = std::max<int>(&bindingRange.last,&(pvVar3->offset).start);
  return *piVar4;
}

Assistant:

int TIntermediate::addUsedOffsets(int binding, int offset, int numOffsets)
{
    TRange bindingRange(binding, binding);
    TRange offsetRange(offset, offset + numOffsets - 1);
    TOffsetRange range(bindingRange, offsetRange);

    // check for collisions, except for vertex inputs on desktop
    for (size_t r = 0; r < usedAtomics.size(); ++r) {
        if (range.overlap(usedAtomics[r])) {
            // there is a collision; pick one
            return std::max(offset, usedAtomics[r].offset.start);
        }
    }

    usedAtomics.push_back(range);

    return -1; // no collision
}